

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

int32_t utrie_swapAnyVersion_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ushort uVar10;
  int32_t iVar11;
  int32_t iVar12;
  ushort uVar13;
  void *pvVar14;
  int iStack_3c;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if (((ulong)inData & 3) != 0 || (inData == (void *)0x0 || length < 0x10)) {
LAB_002c4ee8:
    *pErrorCode = U_INVALID_FORMAT_ERROR;
    return 0;
  }
  iVar8 = *inData;
  if (iVar8 == 0x32697254) {
utrie2_swap_63:
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((inData == (void *)0x0 || ds == (UDataSwapper *)0x0) ||
         (outData == (void *)0x0 && -1 < length)) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      }
      else {
        if (0xf < (uint)length) {
          uVar4 = (*ds->readUInt32)(*inData);
          uVar1 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
          uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 6));
          uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 8));
          if ((uVar2 < 0x840 || ((uVar1 & 0xe) != 0 || uVar4 != 0x54726932)) || uVar3 < 0x30) {
            *pErrorCode = U_INVALID_FORMAT_ERROR;
            return 0;
          }
          iVar8 = (uint)uVar3 * 8;
          if ((uVar1 & 1) != 0) {
            iVar8 = (uint)uVar3 << 4;
          }
          uVar6 = iVar8 + (uint)uVar2 * 2 + 0x10;
          if (length < 0) {
            return uVar6;
          }
          if (uVar6 <= (uint)length) {
            iStack_3c = (uint)uVar3 << 4;
            uVar7 = (uint)uVar2 * 2;
            (*ds->swapArray32)(ds,inData,4,outData,pErrorCode);
            (*ds->swapArray16)(ds,(void *)((long)inData + 4),0xc,(void *)((long)outData + 4),
                               pErrorCode);
            pvVar14 = (void *)((long)inData + 0x10);
            if ((uVar1 & 1) != 0) {
              (*ds->swapArray16)(ds,pvVar14,uVar7,(void *)((long)outData + 0x10),pErrorCode);
              (*ds->swapArray32)(ds,(void *)((long)pvVar14 + (ulong)uVar7),iStack_3c,
                                 (void *)((long)outData + (ulong)uVar7 + 0x10),pErrorCode);
              return uVar6;
            }
            (*ds->swapArray16)(ds,pvVar14,(uint)uVar3 * 8 + uVar7,(void *)((long)outData + 0x10),
                               pErrorCode);
            return uVar6;
          }
        }
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      }
    }
    return 0;
  }
  if (iVar8 != 0x33697254) {
    if (iVar8 == 0x54726932) goto utrie2_swap_63;
    if (iVar8 != 0x54726933) {
      if ((iVar8 == 0x65697254) || (iVar8 == 0x54726965)) {
        iVar11 = 0;
        iVar12 = 0;
        if ((pErrorCode != (UErrorCode *)0x0) &&
           (iVar12 = iVar11, *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
          if ((inData == (void *)0x0 || ds == (UDataSwapper *)0x0) ||
             (outData == (void *)0x0 && -1 < length)) {
            *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
          }
          else if ((uint)length < 0x10) {
            *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          }
          else {
            uVar4 = (*ds->readUInt32)(*inData);
            uVar5 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 4));
            uVar6 = udata_readInt32_63(ds,*(int32_t *)((long)inData + 8));
            uVar7 = udata_readInt32_63(ds,*(int32_t *)((long)inData + 0xc));
            if (((((uVar5 & 0xf) == 5 && uVar4 == 0x54726965) &&
                 (0x7ff < (int)uVar6 && (uVar5 & 0xf0) == 0x20)) && ((uVar6 & 0x1f) == 0)) &&
               (((0x1f < (int)uVar7 && ((uVar7 & 3) == 0)) &&
                ((uVar7 < 0x120 & (byte)(uVar5 >> 9)) != 1)))) {
              iVar12 = (uVar7 << ((uVar5 >> 8 & 1) != 0) + 1) + uVar6 * 2 + 0x10;
              if (-1 < length) {
                if (length < iVar12) {
                  *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                  iVar12 = 0;
                }
                else {
                  (*ds->swapArray32)(ds,inData,0x10,outData,pErrorCode);
                  pvVar14 = (void *)((long)inData + 0x10);
                  if ((uVar5 >> 8 & 1) == 0) {
                    (*ds->swapArray16)(ds,pvVar14,(uVar7 + uVar6) * 2,(void *)((long)outData + 0x10)
                                       ,pErrorCode);
                  }
                  else {
                    (*ds->swapArray16)(ds,pvVar14,uVar6 * 2,(void *)((long)outData + 0x10),
                                       pErrorCode);
                    (*ds->swapArray32)(ds,(void *)((ulong)uVar6 * 2 + (long)pvVar14),uVar7 << 2,
                                       (void *)((long)outData + (ulong)uVar6 * 2 + 0x10),pErrorCode)
                    ;
                  }
                }
              }
            }
            else {
              *pErrorCode = U_INVALID_FORMAT_ERROR;
            }
          }
        }
        return iVar12;
      }
      goto LAB_002c4ee8;
    }
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((inData == (void *)0x0 || ds == (UDataSwapper *)0x0) ||
     (outData == (void *)0x0 && -1 < length)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if ((uint)length < 0x10) {
LAB_002c4c9f:
    *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    uVar4 = (*ds->readUInt32)(*inData);
    uVar1 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
    uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 6));
    uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 8));
    uVar10 = 0x40;
    if ((uVar1 >> 6 & 3) == 0) {
      uVar10 = 0x400;
    }
    if ((((uVar4 == 0x54726933) && ((uVar1 >> 6 & 3) < 2)) &&
        (uVar13 = uVar1 & 7, uVar13 < 3 && (uVar1 & 0x38) == 0)) && (uVar10 <= uVar2)) {
      uVar6 = (uint)uVar3 | (uVar1 & 0xf000) << 4;
      if (0x7f < uVar6) {
        uVar7 = uVar6;
        if (uVar13 != 2) {
          if (uVar13 == 1) {
            uVar7 = uVar6 * 4;
          }
          else {
            uVar7 = uVar6 * 2;
          }
        }
        uVar7 = (uint)uVar2 * 2 + 0x10 + uVar7;
        if (length < 0) {
          return uVar7;
        }
        if (uVar7 <= (uint)length) {
          uVar9 = (uint)uVar2 + (uint)uVar2;
          (*ds->swapArray32)(ds,inData,4,outData,pErrorCode);
          (*ds->swapArray16)(ds,(void *)((long)inData + 4),0xc,(void *)((long)outData + 4),
                             pErrorCode);
          if (uVar13 == 2) {
            (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),uVar9,(void *)((long)outData + 0x10)
                               ,pErrorCode);
            if (inData == outData) {
              return uVar7;
            }
            memmove((void *)((long)outData + 0x10 + (ulong)uVar2 * 0x10),
                    (void *)((long)inData + 0x10 + (ulong)uVar2 * 0x10),(ulong)uVar6);
            return uVar7;
          }
          if (uVar13 == 1) {
            (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),uVar9,(void *)((long)outData + 0x10)
                               ,pErrorCode);
            (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)uVar9 + 0x10),uVar6 << 2,
                               (void *)((long)outData + (ulong)uVar9 + 0x10),pErrorCode);
            return uVar7;
          }
          (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),(uVar6 + uVar2) * 2,
                             (void *)((long)outData + 0x10),pErrorCode);
          return uVar7;
        }
        goto LAB_002c4c9f;
      }
    }
    *pErrorCode = U_INVALID_FORMAT_ERROR;
  }
  return 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }